

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skeleton_blocker_simplifiable.cpp
# Opt level: O2

void __thiscall
test_skeleton_blocker_simplifiable_collapse0::test_method
          (test_skeleton_blocker_simplifiable_collapse0 *this)

{
  ostream *poVar1;
  Simplex simplex_123;
  string local_128;
  undefined1 local_108;
  undefined8 local_100;
  shared_count sStack_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  Complex complex;
  
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  Skeleton_blocker_complex(&complex,5,(Visitor *)0x0);
  build_complete(4,&complex);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_vertex
            (&complex);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            ((Edge_handle *)&simplex_123,&complex,(Vertex_handle)0x2,(Vertex_handle)0x4);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  add_edge_without_blockers
            ((Edge_handle *)&simplex_123,&complex,(Vertex_handle)0x3,(Vertex_handle)0x4);
  poVar1 = std::operator<<((ostream *)&std::clog,"initial complex :\n");
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  to_string_abi_cxx11_((string *)&simplex_123,&complex);
  std::operator<<(poVar1,(string *)&simplex_123);
  std::__cxx11::string::~string((string *)&simplex_123);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  std::endl<char,std::char_traits<char>>(poVar1);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
  Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
            (&simplex_123,(Vertex_handle)0x1,(Vertex_handle)0x2,(Vertex_handle)0x3);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::remove_star
            (&complex,&simplex_123);
  poVar1 = std::operator<<((ostream *)&std::clog,"complex.remove_star(1,2,3):\n");
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  to_string_abi_cxx11_(&local_128,&complex);
  std::operator<<(poVar1,(string *)&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  std::endl<char,std::char_traits<char>>(poVar1);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_simplifiable.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x89);
  local_108 = Gudhi::skeleton_blocker::
              Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
              contains_blocker(&complex,&simplex_123);
  local_100 = 0;
  sStack_f8.pi_ = (sp_counted_base *)0x0;
  local_128.field_2._8_8_ = &local_e0;
  local_e0 = "complex.contains_blocker(simplex_123)";
  local_d8 = "";
  local_128._M_string_length._0_1_ = 0;
  local_128._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_00123bb8;
  local_128.field_2._M_allocated_capacity = (size_type)&boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Skeleton_blocker/test/test_skeleton_blocker_simplifiable.cpp"
  ;
  local_e8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_f8);
  std::
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::~_Rb_tree((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
               *)&simplex_123);
  Gudhi::skeleton_blocker::
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::
  ~Skeleton_blocker_complex(&complex);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_skeleton_blocker_simplifiable_collapse0) {
  Complex complex(5);
  build_complete(4, complex);
  complex.add_vertex();
  complex.add_edge_without_blockers(static_cast<Vertex_handle> (2), static_cast<Vertex_handle> (4));
  complex.add_edge_without_blockers(static_cast<Vertex_handle> (3), static_cast<Vertex_handle> (4));
  // Print result
  std::clog << "initial complex :\n" << complex.to_string();
  std::clog << std::endl << std::endl;

  Simplex simplex_123(static_cast<Vertex_handle> (1), static_cast<Vertex_handle> (2), static_cast<Vertex_handle> (3));
  complex.remove_star(simplex_123);
  std::clog << "complex.remove_star(1,2,3):\n" << complex.to_string();
  std::clog << std::endl << std::endl;

  // verification
  BOOST_CHECK(complex.contains_blocker(simplex_123));
}